

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::checkResultImage(RenderCase *this,Surface *result)

{
  ostringstream *poVar1;
  void *pvVar2;
  TestLog *pTVar3;
  byte bVar4;
  Surface *surface;
  int y;
  int iVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  byte bVar6;
  int iVar7;
  _Alloc_hider _Var8;
  undefined4 uVar9;
  bool bVar10;
  Surface errorMask;
  string local_358;
  string local_338;
  string local_318;
  LogImageSet local_2f8;
  Surface local_2b8;
  string local_2a0;
  string local_280;
  string local_260;
  LogImage local_240;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  tcu::Surface::Surface(&local_2b8,0x100,0x100);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying output image.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  pvVar2 = (result->m_pixels).m_ptr;
  bVar6 = 0;
  iVar5 = 0;
  do {
    iVar7 = 0;
    do {
      bVar4 = bVar6;
      bVar10 = (~*(uint *)((long)pvVar2 + (long)(result->m_width * iVar5 + iVar7) * 4) & 0xff00) !=
               0;
      uVar9 = 0xff00ff00;
      if (bVar10) {
        uVar9 = 0xff0000ff;
      }
      bVar6 = bVar4 | bVar10;
      *(undefined4 *)
       ((long)local_2b8.m_pixels.m_ptr + (long)(local_2b8.m_width * iVar5 + iVar7) * 4) = uVar9;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x100);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x100);
  if ((bool)(bVar4 | bVar10)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Result image has missing or invalid pixels",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Results","");
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Result verification","");
    tcu::LogImageSet::LogImageSet(&local_2f8,&local_338,&local_358);
    tcu::TestLog::startImageSet
              (pTVar3,local_2f8.m_name._M_dataplus._M_p,local_2f8.m_description._M_dataplus._M_p);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Result","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_318,&local_260,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf,(size_t)result);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Error mask","");
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Error mask","");
    surface = &local_2b8;
    tcu::LogImage::LogImage(&local_240,&local_280,&local_2a0,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,(int)pTVar3,__buf_00,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
      operator_delete(local_2f8.m_description._M_dataplus._M_p,
                      local_2f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    local_2f8.m_name.field_2._M_allocated_capacity = local_338.field_2._M_allocated_capacity;
    _Var8._M_p = local_338._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p == &local_338.field_2) goto LAB_0077f680;
  }
  else {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2f8.m_name._M_dataplus._M_p = (pointer)&local_2f8.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Results","");
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Result verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2f8.m_name,&local_338);
    tcu::TestLog::startImageSet
              (pTVar3,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Result","");
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_358,&local_318,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf_01,(size_t)result);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    _Var8._M_p = local_2f8.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p == &local_2f8.m_name.field_2) goto LAB_0077f680;
  }
  operator_delete(_Var8._M_p,local_2f8.m_name.field_2._M_allocated_capacity + 1);
LAB_0077f680:
  tcu::Surface::~Surface(&local_2b8);
  return (bool)~bVar6;
}

Assistant:

bool RenderCase::checkResultImage (const tcu::Surface& result)
{
	tcu::Surface	errorMask	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool			error		= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image." << tcu::TestLog::EndMessage;

	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const tcu::RGBA col = result.getPixel(x, y);

		if (col.getGreen() == 255)
			errorMask.setPixel(x, y, tcu::RGBA::green());
		else
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
	}

	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result image has missing or invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		result)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}